

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,CKey *key,CPubKey *pubkey)

{
  long lVar1;
  WalletStorage *pWVar2;
  array<unsigned_char,_32UL> *__first;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *this_00;
  mapped_type *this_01;
  long in_FS_OFFSET;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  CKeyingMaterial secret;
  CKeyID local_cc;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> crypted_secret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (this->super_ScriptPubKeyMan).m_storage;
  iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x100000000);
  if ((char)iVar4 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x90d,
                  "bool wallet::DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB(WalletBatch &, const CKey &, const CPubKey &)"
                 );
  }
  CPubKey::GetID((CKeyID *)&local_b8,pubkey);
  iVar5 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::find(&(this->m_map_keys)._M_t,(key_type *)&local_b8);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header) {
    CPubKey::GetID((CKeyID *)&crypted_secret,pubkey);
    iVar6 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->m_map_crypted_keys)._M_t,(key_type *)&crypted_secret);
    bVar3 = true;
    if ((_Rb_tree_header *)iVar6._M_node ==
        &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header) {
      iVar4 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
      if ((char)iVar4 == '\0') {
        CPubKey::GetID((CKeyID *)&local_b8,pubkey);
        this_00 = std::
                  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                  ::operator[](&this->m_map_keys,(key_type *)&local_b8);
        CKey::operator=(this_00,key);
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_b8,this);
        CKey::GetPrivKey((CPrivKey *)&crypted_secret,key);
        bVar3 = WalletBatch::WriteDescriptorKey
                          (batch,(uint256 *)&local_b8,pubkey,(CPrivKey *)&crypted_secret);
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&crypted_secret)
        ;
      }
      else {
        iVar4 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[10])();
        if ((char)iVar4 == '\0') {
          crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          __first = (key->keydata)._M_t.
                    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
          std::vector<unsigned_char,secure_allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&secret,
                     __first->_M_elems,
                     __first[__first != (array<unsigned_char,_32UL> *)0x0]._M_elems,
                     (allocator_type *)&local_b8);
          pWVar2 = (this->super_ScriptPubKeyMan).m_storage;
          local_f8 = (code *)0x0;
          pcStack_f0 = (code *)0x0;
          local_108._M_unused._M_object = (void *)0x0;
          local_108._8_8_ = 0;
          local_108._M_unused._M_object = operator_new(0x18);
          *(vector<unsigned_char,secure_allocator<unsigned_char>> **)local_108._M_unused._0_8_ =
               (vector<unsigned_char,secure_allocator<unsigned_char>> *)&secret;
          *(CPubKey **)((long)local_108._M_unused._0_8_ + 8) = pubkey;
          *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
           ((long)local_108._M_unused._0_8_ + 0x10) = &crypted_secret;
          pcStack_f0 = std::
                       _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2332:42)>
                       ::_M_invoke;
          local_f8 = std::
                     _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:2332:42)>
                     ::_M_manager;
          iVar4 = (*pWVar2->_vptr_WalletStorage[8])(pWVar2);
          std::_Function_base::~_Function_base((_Function_base *)&local_108);
          if ((char)iVar4 == '\0') {
            bVar3 = false;
          }
          else {
            memcpy(&local_b8,pubkey,0x41);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_b8.second,&crypted_secret);
            CPubKey::GetID(&local_cc,pubkey);
            this_01 = std::
                      map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::operator[](&this->m_map_crypted_keys,&local_cc);
            std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
            operator=(this_01,&local_b8);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_b8.second.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_b8,this);
            bVar3 = WalletBatch::WriteCryptedDescriptorKey
                              (batch,(uint256 *)&local_b8,pubkey,&crypted_secret);
          }
          std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                    (&secret.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&crypted_secret.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        else {
          bVar3 = false;
        }
      }
    }
  }
  else {
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::AddDescriptorKeyWithDB(WalletBatch& batch, const CKey& key, const CPubKey &pubkey)
{
    AssertLockHeld(cs_desc_man);
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));

    // Check if provided key already exists
    if (m_map_keys.find(pubkey.GetID()) != m_map_keys.end() ||
        m_map_crypted_keys.find(pubkey.GetID()) != m_map_crypted_keys.end()) {
        return true;
    }

    if (m_storage.HasEncryptionKeys()) {
        if (m_storage.IsLocked()) {
            return false;
        }

        std::vector<unsigned char> crypted_secret;
        CKeyingMaterial secret{UCharCast(key.begin()), UCharCast(key.end())};
        if (!m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
                return EncryptSecret(encryption_key, secret, pubkey.GetHash(), crypted_secret);
            })) {
            return false;
        }

        m_map_crypted_keys[pubkey.GetID()] = make_pair(pubkey, crypted_secret);
        return batch.WriteCryptedDescriptorKey(GetID(), pubkey, crypted_secret);
    } else {
        m_map_keys[pubkey.GetID()] = key;
        return batch.WriteDescriptorKey(GetID(), pubkey, key.GetPrivKey());
    }
}